

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playmidi.cpp
# Opt level: O0

void __thiscall Timidity::Renderer::reset_midi(Renderer *this)

{
  int local_14;
  int i;
  Renderer *this_local;
  
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    reset_controllers(this,local_14);
    this->channel[local_14].program = this->default_program;
    this->channel[local_14].panning = -1;
    this->channel[local_14].pitchsens = 200;
    this->channel[local_14].bank = 0;
  }
  reset_voices(this);
  return;
}

Assistant:

void Renderer::reset_midi()
{
	for (int i = 0; i < MAXCHAN; i++)
	{
		reset_controllers(i);
		/* The rest of these are unaffected by the Reset All Controllers event */
		channel[i].program = default_program;
		channel[i].panning = NO_PANNING;
		channel[i].pitchsens = 200;
		channel[i].bank = 0; /* tone bank or drum set */
	}
	reset_voices();
}